

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::chooseRow(HEkkPrimal *this)

{
  int iVar1;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  vector<double,_std::allocator<double>_> *this_00;
  long *in_RDI;
  double dVar6;
  double dVar7;
  double tightSpace_1;
  double tightSpace;
  double alpha_1;
  HighsInt iRow_1;
  HighsInt i_1;
  double bestAlpha;
  double alpha;
  HighsInt iRow;
  HighsInt i;
  double relaxSpace;
  double relaxTheta;
  double alphaTol;
  vector<double,_std::allocator<double>_> *baseValue;
  vector<double,_std::allocator<double>_> *baseUpper;
  vector<double,_std::allocator<double>_> *baseLower;
  HighsSimplexInfo *info;
  value_type in_stack_ffffffffffffff58;
  HighsSimplexAnalysis *in_stack_ffffffffffffff60;
  double local_90;
  double local_88;
  int local_5c;
  double local_58;
  int local_44;
  double local_38;
  
  lVar2 = *in_RDI;
  this_00 = (vector<double,_std::allocator<double>_> *)(lVar2 + 0x2668);
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff60,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB84(in_stack_ffffffffffffff58,0));
  *(undefined4 *)((long)in_RDI + 0x4c) = 0xffffffff;
  if (*(int *)(lVar2 + 0x2944) < 10) {
    local_88 = 1e-09;
  }
  else {
    local_90 = 1e-08;
    if (0x13 < *(int *)(lVar2 + 0x2944)) {
      local_90 = 1e-07;
    }
    local_88 = local_90;
  }
  local_38 = 1e+100;
  for (local_44 = 0; local_44 < *(int *)((long)in_RDI + 0x35c); local_44 = local_44 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x6c),(long)local_44);
    iVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar1);
    dVar6 = *pvVar4 * (double)(int)in_RDI[9];
    if (dVar6 <= local_88) {
      if (dVar6 < -local_88) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar1);
        in_stack_ffffffffffffff58 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2650),(long)iVar1)
        ;
        dVar7 = (in_stack_ffffffffffffff58 - *pvVar5) - (double)in_RDI[5];
        if (local_38 * dVar6 < dVar7) {
          local_38 = dVar7 / dVar6;
        }
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar1);
      in_stack_ffffffffffffff60 = (HighsSimplexAnalysis *)*pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2638),(long)iVar1);
      dVar7 = ((double)in_stack_ffffffffffffff60 - *pvVar5) + (double)in_RDI[5];
      if (dVar7 < local_38 * dVar6) {
        local_38 = dVar7 / dVar6;
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff60,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB84(in_stack_ffffffffffffff58,0));
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffff60,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB84(in_stack_ffffffffffffff58,0));
  local_58 = 0.0;
  for (local_5c = 0; local_5c < *(int *)((long)in_RDI + 0x35c); local_5c = local_5c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x6c),(long)local_5c);
    iVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar1);
    dVar6 = *pvVar4 * (double)(int)in_RDI[9];
    if (dVar6 <= local_88) {
      if (dVar6 < -local_88) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar1);
        dVar7 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2650),(long)iVar1)
        ;
        if ((local_38 * dVar6 < dVar7 - *pvVar5) && (local_58 < -dVar6)) {
          *(int *)((long)in_RDI + 0x4c) = iVar1;
          local_58 = -dVar6;
        }
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar1);
      dVar7 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2638),(long)iVar1);
      if ((dVar7 - *pvVar5 < local_38 * dVar6) && (local_58 < dVar6)) {
        *(int *)((long)in_RDI + 0x4c) = iVar1;
        local_58 = dVar6;
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffff60,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB84(in_stack_ffffffffffffff58,0));
  return;
}

Assistant:

void HEkkPrimal::chooseRow() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Initialize
  row_out = kNoRowChosen;

  // Choose row pass 1
  double alphaTol = info.update_count < 10   ? 1e-9
                    : info.update_count < 20 ? 1e-8
                                             : 1e-7;

  double relaxTheta = 1e100;
  double relaxSpace;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance;
      if (relaxSpace < relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    } else if (alpha < -alphaTol) {
      relaxSpace =
          baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance;
      if (relaxSpace > relaxTheta * alpha) relaxTheta = relaxSpace / alpha;
    }
  }
  analysis->simplexTimerStop(Chuzr1Clock);

  analysis->simplexTimerStart(Chuzr2Clock);
  double bestAlpha = 0;
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double alpha = col_aq.array[iRow] * move_in;
    if (alpha > alphaTol) {
      // Positive pivotal column entry
      double tightSpace = baseValue[iRow] - baseLower[iRow];
      if (tightSpace < relaxTheta * alpha) {
        if (bestAlpha < alpha) {
          bestAlpha = alpha;
          row_out = iRow;
        }
      }
    } else if (alpha < -alphaTol) {
      // Negative pivotal column entry
      double tightSpace = baseValue[iRow] - baseUpper[iRow];
      if (tightSpace > relaxTheta * alpha) {
        if (bestAlpha < -alpha) {
          bestAlpha = -alpha;
          row_out = iRow;
        }
      }
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}